

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

btScalar __thiscall btClock::getTimeSeconds(btClock *this)

{
  unsigned_long uVar1;
  btClock *unaff_retaddr;
  float local_c;
  
  uVar1 = getTimeMicroseconds(unaff_retaddr);
  local_c = (float)uVar1;
  return local_c * 1e-06;
}

Assistant:

btScalar btClock::getTimeSeconds()
{
	static const btScalar microseconds_to_seconds = btScalar(0.000001);
	return btScalar(getTimeMicroseconds()) * microseconds_to_seconds;
}